

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__fill_gif_background(stbi__gif *g,int x0,int y0,int x1,int y1)

{
  stbi_uc (*pasVar1) [4];
  stbi_uc *psVar2;
  stbi_uc *p;
  stbi_uc *c;
  int y;
  int x;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  stbi__gif *g_local;
  
  pasVar1 = g->pal + g->bgindex;
  for (c._0_4_ = y0; c._4_4_ = x0, (int)c < y1; c._0_4_ = g->w * 4 + (int)c) {
    for (; c._4_4_ < x1; c._4_4_ = c._4_4_ + 4) {
      psVar2 = g->out + ((int)c + c._4_4_);
      *psVar2 = (*pasVar1)[2];
      psVar2[1] = (*pasVar1)[1];
      psVar2[2] = (*pasVar1)[0];
      psVar2[3] = '\0';
    }
  }
  return;
}

Assistant:

static void stbi__fill_gif_background(stbi__gif *g, int x0, int y0, int x1, int y1)
{
   int x, y;
   stbi_uc *c = g->pal[g->bgindex];
   for (y = y0; y < y1; y += 4 * g->w) {
      for (x = x0; x < x1; x += 4) {
         stbi_uc *p  = &g->out[y + x];
         p[0] = c[2];
         p[1] = c[1];
         p[2] = c[0];
         p[3] = 0;
      }
   }
}